

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int remain_2;
  float norm_1;
  float mean_1;
  float *ptr_2;
  int q_2;
  int remain_1;
  float norm;
  float *ptr_1;
  int q_1;
  int remain;
  float mean;
  float *ptr;
  int q;
  int size;
  undefined8 in_stack_fffffffffffffeb0;
  Mat *this_00;
  Mat *in_stack_fffffffffffffeb8;
  int local_114;
  Mat local_108;
  Mat *local_d0;
  int local_c4;
  int local_c0;
  float local_bc;
  Mat local_b8;
  float *local_80;
  int local_78;
  int local_74;
  float local_70;
  Mat local_60;
  float *local_28;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  
  local_1c = *(int *)(in_RDI + 0x24) * *(int *)(in_RDI + 0x28);
  local_10 = in_RSI;
  if ((in_RSI == 0) || (in_RDX != 0)) {
    local_18 = in_RDX;
    if ((in_RSI == 0) && (in_RDX != 0)) {
      for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x2c); local_78 = local_78 + 1) {
        channel(in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        pfVar3 = operator_cast_to_float_(&local_b8);
        ~Mat((Mat *)0x159aa8);
        local_bc = *(float *)(local_18 + (long)local_78 * 4);
        local_80 = pfVar3;
        for (local_c0 = local_1c; 0 < local_c0; local_c0 = local_c0 + -1) {
          *local_80 = local_bc * *local_80;
          local_80 = local_80 + 1;
        }
      }
    }
    else if ((in_RSI != 0) && (in_RDX != 0)) {
      for (local_c4 = 0; local_c4 < *(int *)(in_RDI + 0x2c); local_c4 = local_c4 + 1) {
        this_00 = &local_108;
        channel(in_stack_fffffffffffffeb8,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffffeb8 = (Mat *)operator_cast_to_float_(this_00);
        ~Mat((Mat *)0x159be2);
        fVar1 = *(float *)(local_10 + (long)local_c4 * 4);
        fVar2 = *(float *)(local_18 + (long)local_c4 * 4);
        local_d0 = in_stack_fffffffffffffeb8;
        for (local_114 = local_1c; 0 < local_114; local_114 = local_114 + -1) {
          *(float *)&local_d0->data = (*(float *)&local_d0->data - fVar1) * fVar2;
          local_d0 = (Mat *)((long)&local_d0->data + 4);
        }
      }
    }
  }
  else {
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x2c); local_20 = local_20 + 1) {
      channel(in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      pfVar3 = operator_cast_to_float_(&local_60);
      ~Mat((Mat *)0x159964);
      local_70 = *(float *)(local_10 + (long)local_20 * 4);
      local_28 = pfVar3;
      for (local_74 = local_1c; 0 < local_74; local_74 = local_74 + -1) {
        *local_28 = *local_28 - local_70;
        local_28 = local_28 + 1;
      }
    }
  }
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    int size = w * h;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        #pragma omp parallel for
        for (int q=0; q<c; q++)
        {
            float* ptr = channel(q);//data + cstep * q;
            const float mean = mean_vals[q];

#if __ARM_NEON
            int nn = size >> 2;
            int remain = size - (nn << 2);
#else
            int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
            if (nn > 0)
            {
            asm volatile(
                "dup        v1.4s, %w4            \n"
                "0:                               \n"
                "prfm       pldl1keep, [%1, #128] \n"
                "ld1        {v0.4s}, [%1]         \n"
                "fsub       v0.4s, v0.4s, v1.4s   \n"
                "subs       %w0, %w0, #1          \n"
                "st1        {v0.4s}, [%1], #16    \n"
                "bne        0b                    \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean)     // %4
                : "cc", "memory", "v0", "v1"
            );
            }
#else
            if (nn > 0)
            {
            asm volatile(
                "vdup.f32   q1, %4              \n"
                "0:                             \n"
                "pld        [%1, #128]          \n"
                "vld1.f32   {d0-d1}, [%1 :128]  \n"
                "vsub.f32   q0, q0, q1          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d1}, [%1 :128]! \n"
                "bne        0b                  \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean)     // %4
                : "cc", "memory", "q0", "q1"
            );
            }
#endif // __aarch64__
#endif // __ARM_NEON
            for (; remain>0; remain--)
            {
                *ptr -= mean;
                ptr++;
            }
        }
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        #pragma omp parallel for
        for (int q=0; q<c; q++)
        {
            float* ptr = channel(q);//data + cstep * q;
            const float norm = norm_vals[q];

#if __ARM_NEON
            int nn = size >> 2;
            int remain = size - (nn << 2);
#else
            int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
            if (nn > 0)
            {
            asm volatile(
                "dup        v1.4s, %w4            \n"
                "0:                               \n"
                "prfm       pldl1keep, [%1, #128] \n"
                "ld1        {v0.4s}, [%1]         \n"
                "fmul       v0.4s, v0.4s, v1.4s   \n"
                "subs       %w0, %w0, #1          \n"
                "st1        {v0.4s}, [%1], #16    \n"
                "bne        0b                    \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(norm)     // %4
                : "cc", "memory", "v0", "v1"
            );
            }
#else
            if (nn > 0)
            {
            asm volatile(
                "vdup.f32   q1, %4              \n"
                "0:                             \n"
                "pld        [%1, #128]          \n"
                "vld1.f32   {d0-d1}, [%1 :128]  \n"
                "vmul.f32   q0, q0, q1          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d1}, [%1 :128]! \n"
                "bne        0b                  \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(norm)     // %4
                : "cc", "memory", "q0", "q1"
            );
            }
#endif // __aarch64__
#endif // __ARM_NEON
            for (; remain>0; remain--)
            {
                *ptr *= norm;
                ptr++;
            }
        }
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        #pragma omp parallel for
        for (int q=0; q<c; q++)
        {
            float* ptr = channel(q);//data + cstep * q;
            const float mean = mean_vals[q];
            const float norm = norm_vals[q];

#if __ARM_NEON
            int nn = size >> 2;
            int remain = size - (nn << 2);
#else
            int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
            if (nn > 0)
            {
            asm volatile(
                "dup        v1.4s, %w4            \n"
                "dup        v2.4s, %w5            \n"
                "0:                               \n"
                "prfm       pldl1keep, [%1, #128] \n"
                "ld1        {v0.4s}, [%1]         \n"
                "fsub       v0.4s, v0.4s, v1.4s   \n"
                "fmul       v0.4s, v0.4s, v2.4s   \n"
                "subs       %w0, %w0, #1          \n"
                "st1        {v0.4s}, [%1], #16    \n"
                "bne        0b                    \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean),    // %4
                  "r"(norm)     // %5
                : "cc", "memory", "v0", "v1", "v2"
            );  
            }
#else
            if (nn > 0)
            {
            asm volatile(
                "vdup.f32   q1, %4              \n"
                "vdup.f32   q2, %5              \n"
                "0:                             \n"
                "pld        [%1, #128]          \n"
                "vld1.f32   {d0-d1}, [%1 :128]  \n"
                "vsub.f32   q0, q0, q1          \n"
                "vmul.f32   q0, q0, q2          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d1}, [%1 :128]! \n"
                "bne        0b                  \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean),    // %4
                  "r"(norm)     // %5
                : "cc", "memory", "q0", "q1", "q2"
            );
            }
#endif // __aarch64__
#endif // __ARM_NEON
            for (; remain>0; remain--)
            {
                *ptr = (*ptr - mean) * norm;
                ptr++;
            }
        }
    }
}